

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifier.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::CoreMLModels::TextClassifier::ByteSizeLong(TextClassifier *this)

{
  string *psVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  
  psVar1 = (this->language_).ptr_;
  if (psVar1->_M_string_length == 0) {
    sVar4 = 0;
  }
  else {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    sVar4 = sVar4 + 1;
  }
  psVar1 = (this->modelparameterdata_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar5 = google::protobuf::internal::WireFormatLite::BytesSize(psVar1);
    sVar4 = sVar4 + sVar5 + 2;
  }
  if (this->revision_ != 0) {
    uVar3 = this->revision_ | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = sVar4 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->_oneof_case_[0] == 200) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::StringVector>
                      ((this->ClassLabels_).stringclasslabels_);
    sVar4 = sVar4 + sVar5 + 2;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t TextClassifier::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.TextClassifier)
  size_t total_size = 0;

  // string language = 10;
  if (this->language().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->language());
  }

  // bytes modelParameterData = 100;
  if (this->modelparameterdata().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::BytesSize(
        this->modelparameterdata());
  }

  // uint32 revision = 1;
  if (this->revision() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt32Size(
        this->revision());
  }

  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 200;
    case kStringClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}